

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  float lhs;
  bool bVar1;
  double in_RCX;
  double in_RDX;
  double *in_RSI;
  int in_EDI;
  uint in_R9D;
  float in_XMM0_Da;
  float rhs;
  double dVar2;
  float in_XMM1_Da;
  double v_cur_norm_curved;
  double v_new_norm_curved;
  double v_old_norm_curved;
  double v_old_ref_for_accum_remainder;
  unsigned_long_long v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_power;
  bool has_min_max;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  double in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  float local_b8;
  bool local_af;
  int local_a8;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float local_90;
  bool local_8a;
  bool local_89;
  unsigned_long_long in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ImGuiDataType data_type_00;
  char *in_stack_ffffffffffffff88;
  char *local_70;
  double local_68;
  ImVec2 local_58;
  int local_50;
  float local_4c;
  bool local_47;
  byte local_46;
  bool local_45;
  uint local_44;
  ImGuiContext *local_40;
  double local_28;
  double local_20;
  float local_14;
  double *local_10;
  bool local_1;
  
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_40 = GImGui;
  local_44 = (uint)((in_R9D & 1) != 0);
  local_89 = in_EDI == 4 || in_EDI == 5;
  local_45 = local_89;
  local_46 = in_RDX != in_RCX;
  local_8a = false;
  if ((((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) && (local_8a = false, in_EDI == 4 || in_EDI == 5))
     && (local_8a = false, (bool)local_46)) {
    in_stack_ffffffffffffff6c = (float)((long)in_RCX - (long)in_RDX);
    local_90 = (float)(ulong)((long)in_RCX - (long)in_RDX);
    local_8a = local_90 < 3.4028235e+38;
  }
  local_47 = local_8a;
  local_14 = in_XMM0_Da;
  if (((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && ((bool)local_46)) {
    in_stack_ffffffffffffff64 = (float)((long)in_RCX - (long)in_RDX);
    in_stack_ffffffffffffff68 = (float)(ulong)((long)in_RCX - (long)in_RDX);
    if (in_stack_ffffffffffffff68 < 3.4028235e+38) {
      in_stack_ffffffffffffff60 = (float)(ulong)((long)in_RCX - (long)in_RDX);
      local_14 = in_stack_ffffffffffffff60 * GImGui->DragSpeedDefaultRatio;
    }
  }
  local_4c = 0.0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RSI;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), !bVar1)) ||
     ((local_40->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    if (local_40->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((local_45 & 1U) == 0) {
        local_a8 = 0;
      }
      else {
        local_a8 = ImParseFormatPrecision
                             (in_stack_ffffffffffffff38,
                              (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
      local_50 = local_a8;
      local_58 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffff6c,
                                     (ImGuiInputReadMode)in_stack_ffffffffffffff68,
                                     in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      local_4c = ImVec2::operator[](&local_58,(long)(int)local_44);
      lhs = local_14;
      rhs = GetMinimumStepAtDecimalPrecision(SUB84(in_stack_ffffffffffffff30,0));
      local_14 = ImMax<float>(lhs,rhs);
    }
  }
  else {
    local_4c = ImVec2::operator[](&(local_40->IO).MouseDelta,(long)(int)local_44);
    if (((local_40->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((local_40->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  local_4c = local_14 * local_4c;
  if (local_44 == 1) {
    local_4c = -local_4c;
  }
  local_af = false;
  if (((local_46 & 1) != 0) &&
     (((ulong)*local_10 < (ulong)local_28 || (local_af = true, local_4c <= 0.0)))) {
    local_af = (ulong)*local_10 <= (ulong)local_20 && local_4c < 0.0;
  }
  bVar1 = false;
  if (((local_47 & 1U) != 0) &&
     (((0.0 <= local_4c || (bVar1 = true, local_40->DragCurrentAccum <= 0.0)) &&
      (bVar1 = false, 0.0 < local_4c)))) {
    bVar1 = local_40->DragCurrentAccum <= 0.0 && local_40->DragCurrentAccum != 0.0;
  }
  if ((((local_40->ActiveIdIsJustActivated & 1U) != 0) || (local_af)) || (bVar1)) {
    local_40->DragCurrentAccum = 0.0;
    local_40->DragCurrentAccumDirty = false;
  }
  else if ((local_4c != 0.0) || (NAN(local_4c))) {
    local_40->DragCurrentAccum = local_4c + local_40->DragCurrentAccum;
    local_40->DragCurrentAccumDirty = true;
  }
  if ((local_40->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_70 = (char *)0x0;
    if ((local_47 & 1U) != 0) {
      in_stack_ffffffffffffff88 = (char *)ImPow(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
      ;
      local_b8 = (float)(ulong)((long)local_28 - (long)local_20);
      dVar2 = (double)in_stack_ffffffffffffff88 + (double)(local_40->DragCurrentAccum / local_b8);
      in_stack_ffffffffffffff30 = local_20;
      ImSaturate((float)dVar2);
      data_type_00 = (ImGuiDataType)((ulong)dVar2 >> 0x20);
      ImPow(0.0,2.3691e-39);
      local_70 = in_stack_ffffffffffffff88;
    }
    local_68 = (double)RoundScalarWithFormatT<unsigned_long_long,long_long>
                                 (in_stack_ffffffffffffff88,data_type_00,in_stack_ffffffffffffff78);
    local_40->DragCurrentAccumDirty = false;
    if ((local_47 & 1U) == 0) {
      local_40->DragCurrentAccum =
           local_40->DragCurrentAccum - (float)((long)local_68 - (long)*local_10);
    }
    else {
      dVar2 = ImPow(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_40->DragCurrentAccum = local_40->DragCurrentAccum - (float)(dVar2 - (double)local_70);
    }
    if (local_68 == 0.0) {
      local_68 = 0.0;
    }
    if ((*local_10 != local_68) && ((local_46 & 1) != 0)) {
      if (((ulong)local_68 < (ulong)local_20) ||
         ((((ulong)*local_10 < (ulong)local_68 && (local_4c < 0.0)) && ((local_45 & 1U) == 0)))) {
        local_68 = local_20;
      }
      if (((ulong)local_28 < (ulong)local_68) ||
         ((((ulong)local_68 < (ulong)*local_10 && (0.0 < local_4c)) && ((local_45 & 1U) == 0)))) {
        local_68 = local_28;
      }
    }
    if (*local_10 == local_68) {
      local_1 = false;
    }
    else {
      *local_10 = local_68;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}